

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

reg_desc_t * find_rd_by_reg(MIR_context_t ctx,MIR_reg_t reg,MIR_func_t func)

{
  ulong uVar1;
  long *plVar2;
  size_t *psVar3;
  size_t el;
  size_t sVar4;
  int iVar5;
  void *pvVar6;
  MIR_context_t unaff_RBX;
  size_t sVar7;
  ulong unaff_RBP;
  undefined4 in_register_00000034;
  VARR_reg_desc_t *varr;
  uint uVar8;
  MIR_func_t unaff_R14;
  size_t rdn;
  size_t local_50;
  reg_desc_t local_48;
  
  varr = (VARR_reg_desc_t *)CONCAT44(in_register_00000034,reg);
  plVar2 = (long *)func->internal;
  psVar3 = (size_t *)*plVar2;
  if (psVar3 == (size_t *)0x0) {
LAB_00132f60:
    find_rd_by_reg_cold_3();
    ctx = unaff_RBX;
  }
  else if ((void *)psVar3[2] != (void *)0x0) {
    unaff_RBP = (ulong)reg;
    el = *psVar3;
    uVar1 = el + 1;
    if (psVar3[1] < uVar1) {
      sVar7 = (uVar1 >> 1) + uVar1;
      pvVar6 = realloc((void *)psVar3[2],sVar7 * 0x18);
      psVar3[2] = (size_t)pvVar6;
      psVar3[1] = sVar7;
    }
    sVar7 = *psVar3;
    sVar4 = psVar3[2];
    *psVar3 = sVar7 + 1;
    *(undefined4 *)(sVar4 + sVar7 * 0x18) = 6;
    *(MIR_reg_t *)(sVar4 + 4 + sVar7 * 0x18) = reg;
    *(undefined8 *)(sVar4 + 8 + sVar7 * 0x18) = 0;
    iVar5 = HTAB_size_t_do((HTAB_size_t *)plVar2[3],el,HTAB_FIND,&local_50);
    varr = (VARR_reg_desc_t *)*plVar2;
    if (iVar5 == 0) goto LAB_00132f6a;
    if (((varr != (VARR_reg_desc_t *)0x0) && (varr->varr != (reg_desc_t *)0x0)) &&
       (varr->els_num != 0)) {
      varr->els_num = varr->els_num - 1;
      return varr->varr + local_50;
    }
    find_rd_by_reg_cold_1();
    unaff_RBX = ctx;
    unaff_R14 = func;
    goto LAB_00132f60;
  }
  func = unaff_R14;
  find_rd_by_reg_cold_2();
LAB_00132f6a:
  VARR_reg_desc_tpop(&local_48,varr);
  uVar8 = 0xf;
  (*ctx->error_func)(MIR_undeclared_func_reg_error,"undeclared reg %u of func %s",
                     unaff_RBP & 0xffffffff,func->name);
  if (uVar8 < 0xe) {
    return (reg_desc_t *)(&DAT_001aea70 + *(int *)(&DAT_001aea70 + (ulong)uVar8 * 4));
  }
  return (reg_desc_t *)0x1b05a6;
}

Assistant:

static reg_desc_t *find_rd_by_reg (MIR_context_t ctx, MIR_reg_t reg, MIR_func_t func) {
  func_regs_t func_regs = func->internal;
  size_t rdn, temp_rdn;
  reg_desc_t rd;

  rd.reg = reg;
  rd.name = NULL;
  rd.type = MIR_T_I64; /* to eliminate warnings */
  temp_rdn = VARR_LENGTH (reg_desc_t, func_regs->reg_descs);
  VARR_PUSH (reg_desc_t, func_regs->reg_descs, rd);
  if (!HTAB_DO (size_t, func_regs->reg2rdn_tab, temp_rdn, HTAB_FIND, rdn)) {
    VARR_POP (reg_desc_t, func_regs->reg_descs);
    MIR_get_error_func (ctx) (MIR_undeclared_func_reg_error, "undeclared reg %u of func %s", reg,
                              func->name);
  }
  VARR_POP (reg_desc_t, func_regs->reg_descs);
  return &VARR_ADDR (reg_desc_t, func_regs->reg_descs)[rdn];
}